

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Welcome.cpp
# Opt level: O3

void Handlers::Welcome_Msg(Player *player,PacketReader *reader)

{
  byte bVar1;
  World *pWVar2;
  pointer pcVar3;
  Character *pCVar4;
  pointer ppNVar5;
  NPC *pNVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  iterator iVar8;
  iterator iVar9;
  pointer psVar10;
  uchar x;
  uchar y;
  bool bVar11;
  short sVar12;
  int iVar13;
  Map *pMVar14;
  mapped_type *this_00;
  char *pcVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  list<Character_Item,_std::allocator<Character_Item>_> *plVar19;
  list<Character_Spell,_std::allocator<Character_Spell>_> *plVar20;
  NPC **ppNVar21;
  pointer psVar22;
  Character **ppCVar23;
  pointer ppNVar24;
  _List_node_base *p_Var25;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  string str;
  PacketBuilder reply;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  string news_file;
  char newsbuf [4096];
  Character **local_1128;
  iterator iStack_1120;
  Character **local_1118;
  NPC **local_1108;
  iterator iStack_1100;
  NPC **local_10f8;
  string local_10e8;
  PacketBuilder local_10c8;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> local_1098;
  FILE *local_1080;
  string local_1078;
  string local_1058;
  undefined1 local_1038 [4104];
  
  PacketReader::GetThree(reader);
  PacketReader::GetInt(reader);
  pMVar14 = World::GetMap(player->character->world,player->character->mapid);
  if (pMVar14->exists == false) {
    pWVar2 = player->character->world;
    sVar12 = Character::SpawnMap(player->character);
    pMVar14 = World::GetMap(pWVar2,sVar12);
    pcVar3 = (player->character->real_name)._M_dataplus._M_p;
    uVar17 = (ulong)(uint)(int)player->character->mapid;
    if (pMVar14->exists != true) {
      Console::Wrn("Player logged in to non-existent map (%s, map %i) - Disconnected",pcVar3,uVar17)
      ;
      Client::Close(&player->client->super_Client,false);
      return;
    }
    Console::Wrn("Player logged in to non-existent map (%s, map %i) - Position reset",pcVar3,uVar17)
    ;
    pCVar4 = player->character;
    sVar12 = Character::SpawnMap(pCVar4);
    x = Character::SpawnX(player->character);
    y = Character::SpawnY(player->character);
    Character::Warp(pCVar4,sVar12,x,y,WARP_ANIMATION_NONE);
  }
  World::Login(player->world,player->character);
  player->client->state = Playing;
  local_1118 = (Character **)0x0;
  local_1128 = (Character **)0x0;
  iStack_1120._M_current = (Character **)0x0;
  local_10f8 = (NPC **)0x0;
  local_1108 = (NPC **)0x0;
  iStack_1100._M_current = (NPC **)0x0;
  local_1098.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1098.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1098.
  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar14 = player->character->map;
  p_Var25 = (pMVar14->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var25 != (_List_node_base *)&pMVar14->characters) {
    do {
      local_1038._0_8_ = p_Var25[1]._M_next;
      bVar11 = Character::InRange(player->character,(Character *)local_1038._0_8_);
      if (bVar11) {
        if (iStack_1120._M_current == local_1118) {
          std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
                    ((vector<Character*,std::allocator<Character*>> *)&local_1128,iStack_1120,
                     (Character **)local_1038);
        }
        else {
          *iStack_1120._M_current = (Character *)local_1038._0_8_;
          iStack_1120._M_current = iStack_1120._M_current + 1;
        }
      }
      p_Var25 = p_Var25->_M_next;
    } while (p_Var25 != (_List_node_base *)&pMVar14->characters);
    pMVar14 = player->character->map;
  }
  ppNVar24 = (pMVar14->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppNVar5 = (pMVar14->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar24 != ppNVar5) {
    do {
      local_1038._0_8_ = *ppNVar24;
      bVar11 = Character::InRange(player->character,(NPC *)local_1038._0_8_);
      if (bVar11) {
        if (iStack_1100._M_current == local_10f8) {
          std::vector<NPC*,std::allocator<NPC*>>::_M_realloc_insert<NPC*const&>
                    ((vector<NPC*,std::allocator<NPC*>> *)&local_1108,iStack_1100,(NPC **)local_1038
                    );
        }
        else {
          *iStack_1100._M_current = (NPC *)local_1038._0_8_;
          iStack_1100._M_current = iStack_1100._M_current + 1;
        }
      }
      ppNVar24 = ppNVar24 + 1;
    } while (ppNVar24 != ppNVar5);
    pMVar14 = player->character->map;
  }
  p_Var25 = (pMVar14->items).
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var25 != (_List_node_base *)&pMVar14->items) {
    do {
      local_1038._0_8_ = p_Var25[1]._M_next;
      local_1038._8_8_ = p_Var25[1]._M_prev;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_)->_M_use_count + 1;
        }
      }
      bVar11 = Character::InRange(player->character,(Map_Item *)local_1038._0_8_);
      if (bVar11) {
        std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
        push_back(&local_1098,(value_type *)local_1038);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1038._8_8_);
      }
      p_Var25 = p_Var25->_M_next;
    } while (p_Var25 != (_List_node_base *)&pMVar14->items);
  }
  PacketBuilder::PacketBuilder(&local_10c8,PACKET_WELCOME,PACKET_REPLY,0xc);
  PacketBuilder::AddShort(&local_10c8,2);
  PacketBuilder::AddByte(&local_10c8,0xff);
  pWVar2 = player->world;
  local_1038._0_8_ = (Character *)(local_1038 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"NewsFile","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)local_1038);
  util::variant::GetString_abi_cxx11_(&local_1058,this_00);
  if ((Character *)local_1038._0_8_ != (Character *)(local_1038 + 0x10)) {
    operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
  }
  memset(local_1038,0,0x1000);
  local_1080 = fopen(local_1058._M_dataplus._M_p,"rt");
  bVar11 = local_1080 == (FILE *)0x0;
  if (bVar11) {
    Console::Wrn("Could not load news file \'%s\'",local_1058._M_dataplus._M_p);
  }
  lVar18 = 0;
  do {
    if (bVar11) {
LAB_0016a4de:
      PacketBuilder::AddByte(&local_10c8,0xff);
    }
    else {
      pcVar15 = fgets(local_1038,0x1000,local_1080);
      if (pcVar15 == (char *)0x0) {
        bVar11 = true;
        goto LAB_0016a4de;
      }
      local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
      sVar16 = strlen(local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1078,local_1038,local_1038 + sVar16);
      util::trim(&local_10e8,&local_1078);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
        operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
      }
      while (local_10e8._M_string_length < 2) {
        std::__cxx11::string::push_back((char)&local_10e8);
      }
      PacketBuilder::ReserveMore(&local_10c8,(local_10e8._M_string_length - lVar18) + 9);
      PacketBuilder::AddBreakString(&local_10c8,&local_10e8,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10e8._M_dataplus._M_p != &local_10e8.field_2) {
        operator_delete(local_10e8._M_dataplus._M_p,local_10e8.field_2._M_allocated_capacity + 1);
      }
    }
    lVar18 = lVar18 + 1;
    if (lVar18 == 9) {
      if (local_1080 != (FILE *)0x0) {
        fclose(local_1080);
      }
      PacketBuilder::ReserveMore
                (&local_10c8,
                 ((long)iStack_1120._M_current - (long)local_1128 >> 3) * 0x3c +
                 (player->character->spells).
                 super__List_base<Character_Spell,_std::allocator<Character_Spell>_>._M_impl._M_node
                 ._M_size * 4 +
                 (((long)iStack_1100._M_current - (long)local_1108 >> 3) +
                 (player->character->inventory).
                 super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
                 _M_size) * 6 +
                 ((long)local_1098.
                        super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1098.
                        super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * 9 + 7);
      PacketBuilder::AddChar(&local_10c8,player->character->weight);
      PacketBuilder::AddChar(&local_10c8,player->character->maxweight);
      plVar19 = &player->character->inventory;
      p_Var25 = (_List_node_base *)plVar19;
      while (p_Var25 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                        &p_Var25->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var25 != (_List_node_base *)plVar19) {
        iVar13 = *(int *)((long)&p_Var25[1]._M_next + 4);
        PacketBuilder::AddShort(&local_10c8,(int)*(short *)&p_Var25[1]._M_next);
        PacketBuilder::AddInt(&local_10c8,iVar13);
      }
      PacketBuilder::AddByte(&local_10c8,0xff);
      plVar20 = &player->character->spells;
      p_Var25 = (_List_node_base *)plVar20;
      while (p_Var25 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                        &p_Var25->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var25 != (_List_node_base *)plVar20) {
        bVar1 = *(undefined1 *)((long)&p_Var25[1]._M_next + 2);
        PacketBuilder::AddShort(&local_10c8,(int)*(short *)&p_Var25[1]._M_next);
        PacketBuilder::AddShort(&local_10c8,(uint)bVar1);
      }
      PacketBuilder::AddByte(&local_10c8,0xff);
      PacketBuilder::AddChar
                (&local_10c8,(int)((ulong)((long)iStack_1120._M_current - (long)local_1128) >> 3));
      PacketBuilder::AddByte(&local_10c8,0xff);
      iVar8._M_current = iStack_1120._M_current;
      if (local_1128 != iStack_1120._M_current) {
        ppCVar23 = local_1128;
        do {
          pCVar4 = *ppCVar23;
          (*(pCVar4->super_Command_Source)._vptr_Command_Source[2])(&local_10e8,pCVar4);
          PacketBuilder::AddBreakString(&local_10c8,&local_10e8,0xff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10e8._M_dataplus._M_p != &local_10e8.field_2) {
            operator_delete(local_10e8._M_dataplus._M_p,local_10e8.field_2._M_allocated_capacity + 1
                           );
          }
          iVar13 = Character::PlayerID(pCVar4);
          PacketBuilder::AddShort(&local_10c8,iVar13);
          PacketBuilder::AddShort(&local_10c8,(int)pCVar4->mapid);
          PacketBuilder::AddShort(&local_10c8,(uint)pCVar4->x);
          PacketBuilder::AddShort(&local_10c8,(uint)pCVar4->y);
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->direction);
          PacketBuilder::AddChar(&local_10c8,6);
          Character::PaddedGuildTag_abi_cxx11_(&local_10e8,pCVar4);
          PacketBuilder::AddString(&local_10c8,&local_10e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10e8._M_dataplus._M_p != &local_10e8.field_2) {
            operator_delete(local_10e8._M_dataplus._M_p,local_10e8.field_2._M_allocated_capacity + 1
                           );
          }
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->level);
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->gender);
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->hairstyle);
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->haircolor);
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->race);
          PacketBuilder::AddShort(&local_10c8,pCVar4->maxhp);
          PacketBuilder::AddShort(&local_10c8,pCVar4->hp);
          PacketBuilder::AddShort(&local_10c8,pCVar4->maxtp);
          PacketBuilder::AddShort(&local_10c8,pCVar4->tp);
          Character::AddPaperdollData(pCVar4,&local_10c8,"B000A0HSW");
          PacketBuilder::AddChar(&local_10c8,(uint)pCVar4->sitting);
          PacketBuilder::AddChar(&local_10c8,pCVar4->hidden & 1);
          PacketBuilder::AddByte(&local_10c8,0xff);
          ppCVar23 = ppCVar23 + 1;
        } while (ppCVar23 != iVar8._M_current);
      }
      iVar9._M_current = iStack_1100._M_current;
      if (local_1108 != iStack_1100._M_current) {
        ppNVar21 = local_1108;
        do {
          pNVar6 = *ppNVar21;
          if (pNVar6->alive == true) {
            PacketBuilder::AddChar(&local_10c8,(uint)pNVar6->index);
            PacketBuilder::AddShort(&local_10c8,pNVar6->id);
            PacketBuilder::AddChar(&local_10c8,(uint)pNVar6->x);
            PacketBuilder::AddChar(&local_10c8,(uint)pNVar6->y);
            PacketBuilder::AddChar(&local_10c8,(uint)pNVar6->direction);
          }
          ppNVar21 = ppNVar21 + 1;
        } while (ppNVar21 != iVar9._M_current);
      }
      PacketBuilder::AddByte(&local_10c8,0xff);
      psVar10 = local_1098.
                super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1098.
          super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1098.
          super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar22 = local_1098.
                  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          peVar7 = (psVar22->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this = (psVar22->super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this->_M_use_count = this->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this->_M_use_count = this->_M_use_count + 1;
            }
          }
          PacketBuilder::AddShort(&local_10c8,(int)peVar7->uid);
          PacketBuilder::AddShort(&local_10c8,(int)peVar7->id);
          PacketBuilder::AddChar(&local_10c8,(uint)peVar7->x);
          PacketBuilder::AddChar(&local_10c8,(uint)peVar7->y);
          PacketBuilder::AddThree(&local_10c8,peVar7->amount);
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          psVar22 = psVar22 + 1;
        } while (psVar22 != psVar10);
      }
      Player::Send(player,&local_10c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
        operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
      }
      PacketBuilder::~PacketBuilder(&local_10c8);
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
                (&local_1098);
      if (local_1108 != (NPC **)0x0) {
        operator_delete(local_1108,(long)local_10f8 - (long)local_1108);
      }
      if (local_1128 != (Character **)0x0) {
        operator_delete(local_1128,(long)local_1118 - (long)local_1128);
      }
      return;
    }
  } while( true );
}

Assistant:

void Welcome_Msg(Player *player, PacketReader &reader)
{
	reader.GetThree(); // ??
	/*unsigned int id =*/ reader.GetInt(); // Character ID

	if (!player->character->world->GetMap(player->character->mapid)->exists)
	{
		if (player->character->world->GetMap(player->character->SpawnMap())->exists)
		{
			Console::Wrn("Player logged in to non-existent map (%s, map %i) - Position reset", player->character->real_name.c_str(), player->character->mapid);
			player->character->Warp(player->character->SpawnMap(), player->character->SpawnX(), player->character->SpawnY());
		}
		else
		{
			Console::Wrn("Player logged in to non-existent map (%s, map %i) - Disconnected", player->character->real_name.c_str(), player->character->mapid);
			player->client->Close();
			return;
		}
	}

	player->world->Login(player->character);

	player->client->state = EOClient::Playing;

	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(player->character->map->characters, character)
	{
		if (player->character->InRange(character))
		{
			updatecharacters.push_back(character);
		}
	}

	UTIL_FOREACH(player->character->map->npcs, npc)
	{
		if (player->character->InRange(npc))
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(player->character->map->items, item)
	{
		if (player->character->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 3 + 9);

	reply.AddShort(2); // REPLY_WELCOME sub-id
	// MotDs
	reply.AddByte(255);

	std::string news_file = player->world->config["NewsFile"];

	char newsbuf[4096] = "";
	std::FILE *newsfh = std::fopen(news_file.c_str(), "rt");
	bool newseof = (newsfh == 0);

	if (newseof)
	{
		Console::Wrn("Could not load news file '%s'", news_file.c_str());
	}

	for (int i = 0; i < 9; ++i)
	{
		if (!newseof)
		{
			if (!std::fgets(newsbuf, 4096, newsfh))
			{
				newseof = true;
			}
			else
			{
				std::string str = util::trim(newsbuf);

				while (str.length() < 2)
					str += ' ';

				reply.ReserveMore(str.length() + 9 - i);
				reply.AddBreakString(str);
			}
		}

		if (newseof)
		{
			reply.AddByte(255);
		}
	}

	if (newsfh)
	{
		std::fclose(newsfh);
	}

	reply.ReserveMore(7 + player->character->inventory.size() * 6 + player->character->spells.size() * 4
		+ updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);

	// ??
	reply.AddChar(player->character->weight); // Weight
	reply.AddChar(player->character->maxweight); // Max Weight
	UTIL_FOREACH(player->character->inventory, item)
	{
		reply.AddShort(item.id);
		reply.AddInt(item.amount);
	}
	reply.AddByte(255);
	UTIL_FOREACH(player->character->spells, spell)
	{
		reply.AddShort(spell.id); // Spell ID
		reply.AddShort(spell.level); // Spell Level
	}
	reply.AddByte(255);

	reply.AddChar(updatecharacters.size()); // Number of players
	reply.AddByte(255);
	UTIL_FOREACH(updatecharacters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddShort(character->PlayerID());
		reply.AddShort(character->mapid);
		reply.AddShort(character->x);
		reply.AddShort(character->y);
		reply.AddChar(character->direction);
		reply.AddChar(6); // ?
		reply.AddString(character->PaddedGuildTag());
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddShort(character->maxhp);
		reply.AddShort(character->hp);
		reply.AddShort(character->maxtp);
		reply.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(reply, "B000A0HSW");

		reply.AddChar(character->sitting);
		reply.AddChar(character->IsHideInvisible());
		reply.AddByte(255);
	}
	UTIL_FOREACH(updatenpcs, npc)
	{
		if (npc->alive)
		{
			reply.AddChar(npc->index);
			reply.AddShort(npc->id);
			reply.AddChar(npc->x);
			reply.AddChar(npc->y);
			reply.AddChar(npc->direction);
		}
	}
	reply.AddByte(255);
	UTIL_FOREACH(updateitems, item)
	{
		reply.AddShort(item->uid);
		reply.AddShort(item->id);
		reply.AddChar(item->x);
		reply.AddChar(item->y);
		reply.AddThree(item->amount);
	}
	player->Send(reply);
}